

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expected.h
# Opt level: O1

void __thiscall
Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Expected(Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->field_0).value_.type_ = value->type_;
  paVar1 = &(this->field_0).value_.string_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&this->field_0 + 8) = paVar1;
  pcVar3 = (value->string_)._M_dataplus._M_p;
  paVar2 = &(value->string_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(value->string_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->field_0).value_.string_.field_2 + 8) = uVar4;
  }
  else {
    (this->field_0).value_.string_._M_dataplus._M_p = pcVar3;
    (this->field_0).value_.string_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->field_0).value_.string_._M_string_length = (value->string_)._M_string_length;
  (value->string_)._M_dataplus._M_p = (pointer)paVar2;
  (value->string_)._M_string_length = 0;
  (value->string_).field_2._M_local_buf[0] = '\0';
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->field_0).value_.mapping_.map_._M_t._M_impl.super__Rb_tree_header,
             &(value->mapping_).map_._M_t._M_impl.super__Rb_tree_header);
  (this->field_0).value_.sequence_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (value->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->field_0).value_.sequence_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (value->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->field_0).value_.sequence_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (value->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (value->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->has_value_ = true;
  return;
}

Assistant:

Expected(T &&value) : value_(std::move(value)), has_value_(true) {}